

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_algorithm.hpp
# Opt level: O1

void __thiscall
ranges::detail::sift_down_n_fn::operator()
          (sift_down_n_fn *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          iter_difference_t<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_> len,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> start,
          reference_wrapper<ranges::less> pred,reference_wrapper<ranges::identity> proj)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (1 < len) {
    uVar3 = len - 2U >> 1;
    if ((long)start._M_current - (long)first._M_current >> 2 <= (long)uVar3) {
      uVar6 = (long)start._M_current - (long)first._M_current >> 1;
      piVar5 = first._M_current + uVar6 + 1;
      uVar7 = uVar6 | 1;
      if (((long)(uVar6 + 2) < len) && (*piVar5 < first._M_current[uVar6 + 2])) {
        piVar5 = first._M_current + uVar6 + 2;
        uVar7 = uVar6 + 2;
      }
      iVar2 = *start._M_current;
      if (iVar2 <= *piVar5) {
        do {
          piVar4 = piVar5;
          *start._M_current = *piVar4;
          if ((long)uVar3 < (long)uVar7) break;
          uVar6 = uVar7 * 2 + 1;
          piVar5 = first._M_current + uVar7 * 2 + 1;
          uVar1 = uVar7 * 2 + 2;
          if (((long)uVar1 < len) && (*piVar5 < first._M_current[uVar7 * 2 + 2])) {
            piVar5 = first._M_current + uVar7 * 2 + 2;
            uVar6 = uVar1;
          }
          uVar7 = uVar6;
          start._M_current = piVar4;
        } while (iVar2 <= *piVar5);
        *piVar4 = iVar2;
      }
    }
  }
  return;
}

Assistant:

void operator()(I first, iter_difference_t<I> len, I start, C pred = C{},
                            P proj = P{}) const
            {
                // left-child of start is at 2 * start + 1
                // right-child of start is at 2 * start + 2
                auto child = start - first;

                if(len < 2 || (len - 2) / 2 < child)
                    return;

                child = 2 * child + 1;
                I child_i = first + child;

                if((child + 1) < len &&
                   invoke(pred, invoke(proj, *child_i), invoke(proj, *(child_i + 1))))
                {
                    // right-child exists and is greater than left-child
                    ++child_i;
                    ++child;
                }

                // check if we are in heap-order
                if(invoke(pred, invoke(proj, *child_i), invoke(proj, *start)))
                    // we are, start is larger than it's largest child
                    return;

                iter_value_t<I> top = iter_move(start);
                do
                {
                    // we are not in heap-order, swap the parent with it's largest child
                    *start = iter_move(child_i);
                    start = child_i;

                    if((len - 2) / 2 < child)
                        break;

                    // recompute the child based off of the updated parent
                    child = 2 * child + 1;
                    child_i = first + child;

                    if((child + 1) < len &&
                       invoke(pred, invoke(proj, *child_i), invoke(proj, *(child_i + 1))))
                    {
                        // right-child exists and is greater than left-child
                        ++child_i;
                        ++child;
                    }

                    // check if we are in heap-order
                } while(!invoke(pred, invoke(proj, *child_i), invoke(proj, top)));
                *start = std::move(top);
            }